

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.cpp
# Opt level: O1

void __thiscall xscript::parser::ast_node::ast_node(ast_node *this)

{
  (this->children).
  super__Vector_base<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).
  super__Vector_base<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->parent = (ast_node *)0x0;
  (this->children).
  super__Vector_base<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this->type = ROOT;
  tokenizer::token::token(&this->token);
  (this->regs).super___shared_ptr<xscript::parser::register_allocator,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->regs).super___shared_ptr<xscript::parser::register_allocator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->symbols).super___shared_ptr<xscript::parser::symbol_table,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->symbols).super___shared_ptr<xscript::parser::symbol_table,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

ast_node::ast_node() :
    parent(nullptr),
    type(ROOT)
{

}